

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O0

bool __thiscall
glcts::anon_unknown_0::ComputeShaderBase::ValidateReadBufferCenteredQuad
          (ComputeShaderBase *this,int width,int height,vec3 *expected)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  reference pixels;
  byte *pbVar4;
  reference pvVar5;
  float fVar6;
  Vector<float,_3> local_dc;
  Vector<float,_3> local_d0;
  Vector<float,_3> local_c4;
  Vector<float,_3> local_b8;
  undefined4 local_ac;
  int local_a8;
  int local_a4;
  int idx;
  int x;
  int y;
  int endy;
  int endx;
  int starty;
  int startx;
  float local_84;
  int local_80;
  allocator<unsigned_char> local_79;
  int i;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  allocator<tcu::Vector<float,_3>_> local_49;
  undefined1 local_48 [8];
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> fb;
  bool result;
  vec3 *expected_local;
  int height_local;
  int width_local;
  ComputeShaderBase *this_local;
  
  fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  std::allocator<tcu::Vector<float,_3>_>::allocator(&local_49);
  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
            ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)local_48,
             (long)(width * height),&local_49);
  std::allocator<tcu::Vector<float,_3>_>::~allocator(&local_49);
  std::allocator<unsigned_char>::allocator(&local_79);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i,(long)(width * height * 4),
             &local_79);
  std::allocator<unsigned_char>::~allocator(&local_79);
  pixels = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i,0);
  glu::CallLogWrapper::glReadPixels
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0,0,width,height,0x1908
             ,0x1401,pixels);
  for (local_80 = 0; local_80 < width * height * 4; local_80 = local_80 + 4) {
    pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i,(long)local_80);
    bVar1 = *pbVar4;
    pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i,
                        (long)(local_80 + 1));
    bVar2 = *pbVar4;
    pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i,
                        (long)(local_80 + 2));
    tcu::Vector<float,_3>::Vector
              ((Vector<float,_3> *)&starty,(float)bVar1 / 255.0,(float)bVar2 / 255.0,
               (float)*pbVar4 / 255.0);
    pvVar5 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::operator[]
                       ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                        local_48,(long)(local_80 / 4));
    *(undefined8 *)pvVar5->m_data = _starty;
    pvVar5->m_data[2] = local_84;
  }
  endx = (int)((float)width * 0.1 + 1.0);
  idx = (int)((float)height * 0.1 + 1.0);
  fVar6 = (float)width * 0.1 + 1.0;
  y = (int)(((float)width - (fVar6 + fVar6)) - 1.0);
  fVar6 = (float)height * 0.1 + 1.0;
  x = (int)(((float)height - (fVar6 + fVar6)) - 1.0);
  endy = idx;
  do {
    if (x <= idx) {
      pvVar5 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
               operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                          local_48,(long)(width * 2 + 2));
      tcu::Vector<float,_3>::Vector(&local_b8,0.0);
      bVar3 = ColorEqual(this,pvVar5,&local_b8,&this->g_color_eps);
      if (((bVar3 ^ 0xffU) & 1) != 0) {
        fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
      }
      pvVar5 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
               operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                          local_48,(long)(width * 3 + -3));
      tcu::Vector<float,_3>::Vector(&local_c4,0.0);
      bVar3 = ColorEqual(this,pvVar5,&local_c4,&this->g_color_eps);
      if (((bVar3 ^ 0xffU) & 1) != 0) {
        fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
      }
      pvVar5 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
               operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                          local_48,(long)(width + -3 + (height + -3) * width));
      tcu::Vector<float,_3>::Vector(&local_d0,0.0);
      bVar3 = ColorEqual(this,pvVar5,&local_d0,&this->g_color_eps);
      if (((bVar3 ^ 0xffU) & 1) != 0) {
        fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
      }
      pvVar5 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
               operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                          local_48,(long)((height + -3) * width + 2));
      tcu::Vector<float,_3>::Vector(&local_dc,0.0);
      bVar3 = ColorEqual(this,pvVar5,&local_dc,&this->g_color_eps);
      if (((bVar3 ^ 0xffU) & 1) != 0) {
        fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
      }
      this_local._7_1_ =
           (bool)(fb.
                  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1);
LAB_0141915e:
      local_ac = 1;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i);
      std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::~vector
                ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)local_48)
      ;
      return this_local._7_1_;
    }
    for (local_a4 = endx; local_a4 < y; local_a4 = local_a4 + 1) {
      local_a8 = idx * width + local_a4;
      pvVar5 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
               operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                          local_48,(long)local_a8);
      bVar3 = ColorEqual(this,pvVar5,expected,&this->g_color_eps);
      if (!bVar3) {
        this_local._7_1_ = false;
        goto LAB_0141915e;
      }
    }
    idx = idx + 1;
  } while( true );
}

Assistant:

bool ValidateReadBufferCenteredQuad(int width, int height, const vec3& expected)
	{
		bool				 result = true;
		std::vector<vec3>	fb(width * height);
		std::vector<GLubyte> data(width * height * 4);
		glReadPixels(0, 0, width, height, GL_RGBA, GL_UNSIGNED_BYTE, &data[0]);

		for (int i = 0; i < width * height * 4; i += 4)
		{
			fb[i / 4] = vec3(static_cast<GLfloat>(data[i] / 255.), static_cast<GLfloat>(data[i + 1] / 255.),
							 static_cast<GLfloat>(data[i + 2] / 255.));
		}

		int startx = int((static_cast<float>(width) * 0.1f) + 1);
		int starty = int((static_cast<float>(height) * 0.1f) + 1);
		int endx   = int(static_cast<float>(width) - 2 * ((static_cast<float>(width) * 0.1f) + 1) - 1);
		int endy   = int(static_cast<float>(height) - 2 * ((static_cast<float>(height) * 0.1f) + 1) - 1);

		for (int y = starty; y < endy; ++y)
		{
			for (int x = startx; x < endx; ++x)
			{
				const int idx = y * width + x;
				if (!ColorEqual(fb[idx], expected, g_color_eps))
				{
					return false;
				}
			}
		}

		if (!ColorEqual(fb[2 * width + 2], vec3(0), g_color_eps))
		{
			result = false;
		}
		if (!ColorEqual(fb[2 * width + (width - 3)], vec3(0), g_color_eps))
		{
			result = false;
		}
		if (!ColorEqual(fb[(height - 3) * width + (width - 3)], vec3(0), g_color_eps))
		{
			result = false;
		}
		if (!ColorEqual(fb[(height - 3) * width + 2], vec3(0), g_color_eps))
		{
			result = false;
		}

		return result;
	}